

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [2]
          )

{
  string local_c8 [32];
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  char (*args_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *arg_local;
  string *s;
  
  local_29 = 0;
  local_28 = args;
  args_local_1 = (char (*) [2])arg;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  arg_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)this,&local_71);
  to_string(&local_50,&local_70);
  std::__cxx11::string::string(local_c8,(string *)args_local_1);
  format<std::__cxx11::string,char_const(&)[2]>
            (&local_a8,(util *)local_c8,local_28,(char (*) [2])args);
  std::operator+(__return_storage_ptr__,&local_50,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}